

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

string * duckdb::NumericHelper::ToString<unsigned_int>(string *__return_storage_ptr__,uint value)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  string *__str;
  
  cVar4 = '\x01';
  if (9 < value) {
    uVar2 = value;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar2 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0143d512;
      }
      if (uVar2 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0143d512;
      }
      if (uVar2 < 10000) goto LAB_0143d512;
      bVar1 = 99999 < uVar2;
      uVar2 = uVar2 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_0143d512:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar4);
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,value);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(T value) {
		return std::to_string(value);
	}